

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_retention.pb.cc
# Opt level: O2

void proto2_unittest::TopLevelMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  int iVar3;
  Nullable<const_char_*> failure_msg;
  TopLevelMessage *_this;
  TopLevelMessage *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TopLevelMessage *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TopLevelMessage_const*,proto2_unittest::TopLevelMessage*>
                          ((TopLevelMessage **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x20) =
           *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
    pHVar1 = &(local_20->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
    iVar3 = *(int *)&from_msg[4]._vptr_MessageLite;
    if (iVar3 != 0) {
      if (*(int *)((long)&local_20->field_0 + 0x30) != iVar3) {
        *(int *)((long)&local_20->field_0 + 0x30) = iVar3;
      }
      if (iVar3 == 2) {
        *(intptr_t *)((long)&local_20->field_0 + 0x28) = from_msg[3]._internal_metadata_.ptr_;
      }
    }
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(local_20->field_0)._impl_._extensions_,
               (MessageLite *)_TopLevelMessage_default_instance_,(ExtensionSet *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_retention.pb.cc"
             ,0x48e,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TopLevelMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TopLevelMessage*>(&to_msg);
  auto& from = static_cast<const TopLevelMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TopLevelMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.f_ = from._impl_.f_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kI: {
        _this->_impl_.o_.i_ = from._impl_.o_.i_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}